

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImGuiNavMoveResult *pIVar1;
  int *piVar2;
  ImGuiNextWindowData *pIVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  float fVar6;
  ImVec2 IVar7;
  byte bVar8;
  ImGuiContextHook *pIVar9;
  ImFontAtlas *pIVar10;
  uint *puVar11;
  ImGuiViewportP *pIVar12;
  ImGuiWindow **ppIVar13;
  ImGuiPopupData *pIVar14;
  ImGuiGroupData *pIVar15;
  ImRect IVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  ImGuiContext *pIVar26;
  ImGuiContext *pIVar27;
  ImGuiID IVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  uint uVar33;
  int iVar34;
  ImGuiID IVar35;
  uint uVar36;
  ImGuiInputSource IVar37;
  ImGuiContext *g_4;
  uint *__dest;
  ImGuiWindow *pIVar38;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar39;
  int *piVar40;
  ImGuiGroupData *__dest_02;
  byte bVar41;
  int i;
  ImGuiID IVar42;
  ImGuiWindow *window;
  char *pcVar43;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar44;
  ImGuiContext *g;
  int i_1;
  int iVar45;
  ImGuiDir IVar46;
  ImRect *pIVar47;
  ImGuiID IVar48;
  ImGuiNavLayer IVar49;
  ImGuiID IVar50;
  ImFont *font;
  long lVar51;
  long lVar52;
  ImGuiContext *g_1;
  ImGuiContext *g_2;
  ImGuiNavMoveResult *pIVar53;
  ImGuiContext *ctx;
  ulong uVar54;
  long lVar55;
  bool *pbVar56;
  ImGuiContext *pIVar57;
  ImGuiWindow *old_nav_window;
  long lVar58;
  ImGuiContext *pIVar59;
  float fVar60;
  float fVar61;
  undefined8 uVar62;
  undefined1 auVar65 [16];
  ImVec4 IVar66;
  undefined1 auVar67 [16];
  ImVec2 IVar63;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ImRect IVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar64;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined8 uVar85;
  undefined1 auVar82 [64];
  undefined1 extraout_var [56];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float local_78;
  ImRect local_40;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  pIVar26 = GImGui;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf01,"void ImGui::NewFrame()");
  }
  uVar33 = (GImGui->Hooks).Size;
  uVar54 = (ulong)(int)uVar33;
  if (0 < (long)uVar54) {
    lVar58 = -uVar54;
    lVar55 = uVar54 << 5;
    do {
      if ((long)(int)uVar33 < (long)uVar54) {
        pcVar43 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_0015295f;
      }
      pIVar9 = (pIVar26->Hooks).Data;
      if (*(int *)(pIVar9 + lVar55 + -0x1c) == 7) {
        memmove(pIVar9 + lVar55 + -0x20,pIVar9 + lVar55,((ulong)uVar33 + lVar58) * 0x20);
        uVar33 = (pIVar26->Hooks).Size - 1;
        (pIVar26->Hooks).Size = uVar33;
      }
      lVar58 = lVar58 + 1;
      bVar29 = 1 < uVar54;
      uVar54 = uVar54 - 1;
      lVar55 = lVar55 + -0x20;
    } while (bVar29);
    if (0 < (int)uVar33) {
      lVar55 = 0;
      lVar58 = 0;
      do {
        pIVar9 = (pIVar26->Hooks).Data;
        if (*(int *)(pIVar9 + lVar55 + 4) == 0) {
          (**(code **)(pIVar9 + lVar55 + 0x10))();
          uVar33 = (pIVar26->Hooks).Size;
        }
        lVar58 = lVar58 + 1;
        lVar55 = lVar55 + 0x20;
      } while (lVar58 < (int)uVar33);
    }
  }
  pIVar57 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar45 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar45 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1b8e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar45 != 0) && (GImGui->FrameCountEnded != iVar45)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b90,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar10 = (GImGui->IO).Fonts;
  if ((pIVar10->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b91,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar10->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b92,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b93,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b94,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar60 = (GImGui->Style).Alpha;
  if ((fVar60 < 0.0) || (1.0 < fVar60)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b96,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar55 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar55] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1b99,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b9d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar57->SettingsLoaded == false) {
    if ((pIVar57->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x27b3,"void ImGui::UpdateSettings()");
    }
    pcVar43 = (pIVar57->IO).IniFilename;
    if (pcVar43 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar43);
    }
    pIVar57->SettingsLoaded = true;
  }
  if ((0.0 < pIVar57->SettingsDirtyTimer) &&
     (fVar60 = pIVar57->SettingsDirtyTimer - (pIVar57->IO).DeltaTime,
     pIVar57->SettingsDirtyTimer = fVar60, fVar60 <= 0.0)) {
    pcVar43 = (pIVar57->IO).IniFilename;
    if (pcVar43 == (char *)0x0) {
      (pIVar57->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar43);
    }
    pIVar57->SettingsDirtyTimer = 0.0;
  }
  fVar60 = (pIVar26->IO).DeltaTime;
  pIVar26->Time = (double)fVar60 + pIVar26->Time;
  pIVar26->WithinFrameScope = true;
  pIVar26->FrameCount = pIVar26->FrameCount + 1;
  pIVar26->TooltipOverrideCount = 0;
  pIVar26->WindowsActiveCount = 0;
  if ((pIVar26->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar11 = (pIVar26->MenusIdSubmittedThisFrame).Data;
    if (puVar11 != (uint *)0x0) {
      memcpy(__dest,puVar11,(long)(pIVar26->MenusIdSubmittedThisFrame).Size << 2);
      puVar11 = (pIVar26->MenusIdSubmittedThisFrame).Data;
      if ((puVar11 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar11,GImAllocatorUserData);
    }
    (pIVar26->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar26->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar60 = (pIVar26->IO).DeltaTime;
  }
  pIVar57 = GImGui;
  (pIVar26->MenusIdSubmittedThisFrame).Size = 0;
  iVar45 = pIVar26->FramerateSecPerFrameIdx;
  pIVar26->FramerateSecPerFrameAccum =
       (fVar60 - pIVar26->FramerateSecPerFrame[iVar45]) + pIVar26->FramerateSecPerFrameAccum;
  pIVar26->FramerateSecPerFrame[iVar45] = fVar60;
  iVar34 = iVar45 + (int)((ulong)((long)(iVar45 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar26->FramerateSecPerFrameIdx = iVar45 + 1 + ((iVar34 >> 6) - (iVar34 >> 0x1f)) * -0x78;
  auVar68._0_12_ = ZEXT812(0);
  auVar68._12_4_ = 0;
  auVar68 = vcmpss_avx(auVar68,ZEXT416((uint)pIVar26->FramerateSecPerFrameAccum),1);
  auVar65._8_4_ = 0x7f7fffff;
  auVar65._0_8_ = 0x7f7fffff7f7fffff;
  auVar65._12_4_ = 0x7f7fffff;
  auVar68 = vblendvps_avx(auVar65,ZEXT416((uint)(1.0 / (pIVar26->FramerateSecPerFrameAccum / 120.0))
                                         ),auVar68);
  (pIVar26->IO).Framerate = auVar68._0_4_;
  if ((pIVar57->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x28e2,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar12 = *(pIVar57->Viewports).Data;
  (pIVar12->super_ImGuiViewport).Flags = 5;
  (pIVar12->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar12->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar12->super_ImGuiViewport).Size = (pIVar57->IO).DisplaySize;
  if (0 < (pIVar57->Viewports).Size) {
    lVar55 = 0;
    do {
      pIVar12 = (pIVar57->Viewports).Data[lVar55];
      pIVar12->WorkOffsetMin = pIVar12->CurrWorkOffsetMin;
      pIVar12->WorkOffsetMax = pIVar12->CurrWorkOffsetMax;
      uVar62 = SUB168(ZEXT816(0) << 0x20,0);
      uVar85 = SUB168(ZEXT816(0) << 0x20,8);
      (pIVar12->CurrWorkOffsetMin).x = (float)(int)uVar62;
      (pIVar12->CurrWorkOffsetMin).y = (float)(int)((ulong)uVar62 >> 0x20);
      (pIVar12->CurrWorkOffsetMax).x = (float)(int)uVar85;
      (pIVar12->CurrWorkOffsetMax).y = (float)(int)((ulong)uVar85 >> 0x20);
      ImGuiViewportP::UpdateWorkRect(pIVar12);
      lVar55 = lVar55 + 1;
    } while (lVar55 < (pIVar57->Viewports).Size);
  }
  ((pIVar26->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar10 = (GImGui->IO).Fonts;
    if ((pIVar10->Fonts).Size < 1) {
      pcVar43 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_0015295f:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x66a,pcVar43);
    }
    font = *(pIVar10->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar26->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf24,"void ImGui::NewFrame()");
  }
  lVar55 = (long)(pIVar26->Viewports).Size;
  IVar66 = _DAT_001e8b70;
  if (0 < lVar55) {
    auVar82 = ZEXT1664((undefined1  [16])_DAT_001e8b70);
    lVar58 = 0;
    do {
      pIVar12 = (pIVar26->Viewports).Data[lVar58];
      fVar60 = (pIVar12->super_ImGuiViewport).Pos.x;
      if (fVar60 < auVar82._0_4_) {
        auVar82 = ZEXT1664(CONCAT124(auVar82._4_12_,fVar60));
      }
      fVar61 = (pIVar12->super_ImGuiViewport).Pos.y;
      auVar68 = vmovshdup_avx(auVar82._0_16_);
      if (fVar61 < auVar68._0_4_) {
        auVar68 = vinsertps_avx(auVar82._0_16_,ZEXT416((uint)fVar61),0x10);
        auVar82 = ZEXT1664(auVar68);
      }
      fVar60 = fVar60 + (pIVar12->super_ImGuiViewport).Size.x;
      auVar65 = auVar82._0_16_;
      auVar68 = vshufpd_avx(auVar65,auVar65,1);
      if (auVar68._0_4_ < fVar60) {
        auVar68 = vinsertps_avx(auVar65,ZEXT416((uint)fVar60),0x20);
        auVar82 = ZEXT1664(auVar68);
      }
      fVar61 = fVar61 + (pIVar12->super_ImGuiViewport).Size.y;
      auVar65 = auVar82._0_16_;
      auVar68 = vshufps_avx(auVar65,auVar65,0xff);
      if (auVar68._0_4_ < fVar61) {
        auVar68 = vinsertps_avx(auVar65,ZEXT416((uint)fVar61),0x30);
        auVar82 = ZEXT1664(auVar68);
      }
      IVar66 = auVar82._0_16_;
      lVar58 = lVar58 + 1;
    } while (lVar55 != lVar58);
  }
  (pIVar26->DrawListSharedData).ClipRectFullscreen = IVar66;
  fVar60 = (pIVar26->Style).CircleTessellationMaxError;
  (pIVar26->DrawListSharedData).CurveTessellationTol = (pIVar26->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar26->DrawListSharedData,fVar60);
  bVar29 = (pIVar26->Style).AntiAliasedLines;
  uVar33 = (uint)bVar29;
  (pIVar26->DrawListSharedData).InitialFlags = (uint)bVar29;
  if (((pIVar26->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar26->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar33 = bVar29 | 2;
    (pIVar26->DrawListSharedData).InitialFlags = uVar33;
  }
  if ((pIVar26->Style).AntiAliasedFill == true) {
    uVar33 = uVar33 | 4;
    (pIVar26->DrawListSharedData).InitialFlags = uVar33;
  }
  if (((pIVar26->IO).BackendFlags & 8) != 0) {
    (pIVar26->DrawListSharedData).InitialFlags = uVar33 | 8;
  }
  if (0 < (pIVar26->Viewports).Size) {
    lVar55 = 0;
    do {
      pIVar12 = (pIVar26->Viewports).Data[lVar55];
      (pIVar12->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar12->DrawDataP).DisplayPos.x = 0.0;
      (pIVar12->DrawDataP).DisplayPos.y = 0.0;
      (pIVar12->DrawDataP).DisplaySize.x = 0.0;
      (pIVar12->DrawDataP).DisplaySize.y = 0.0;
      (pIVar12->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar12->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar12->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar12->DrawDataP).field_0x1 = 0;
      (pIVar12->DrawDataP).CmdListsCount = 0;
      (pIVar12->DrawDataP).TotalIdxCount = 0;
      (pIVar12->DrawDataP).TotalVtxCount = 0;
      (pIVar12->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar12->DrawDataP).DisplayPos.x = 0.0;
      (pIVar12->DrawDataP).DisplayPos.y = 0.0;
      lVar55 = lVar55 + 1;
    } while (lVar55 < (pIVar26->Viewports).Size);
  }
  pIVar57 = GImGui;
  if ((pIVar26->DragDropActive != false) &&
     (IVar42 = (pIVar26->DragDropPayload).SourceId, IVar42 == pIVar26->ActiveId)) {
    if (GImGui->ActiveId == IVar42) {
      GImGui->ActiveIdIsAlive = IVar42;
    }
    if (pIVar57->ActiveIdPreviousFrame == IVar42) {
      pIVar57->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar26->HoveredIdPreviousFrame == 0) {
    IVar42 = pIVar26->HoveredId;
    pIVar26->HoveredIdTimer = 0.0;
    pIVar26->HoveredIdNotActiveTimer = 0.0;
    if (IVar42 == 0) goto LAB_0014fc9a;
LAB_0014fc77:
    fVar60 = (pIVar26->IO).DeltaTime;
    pIVar26->HoveredIdTimer = fVar60 + pIVar26->HoveredIdTimer;
    IVar35 = IVar42;
    if (pIVar26->ActiveId != IVar42) {
      pIVar26->HoveredIdNotActiveTimer = fVar60 + pIVar26->HoveredIdNotActiveTimer;
      IVar35 = pIVar26->ActiveId;
    }
  }
  else {
    IVar42 = pIVar26->HoveredId;
    if (IVar42 != 0) {
      if (pIVar26->ActiveId == IVar42) {
        pIVar26->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0014fc77;
    }
LAB_0014fc9a:
    IVar42 = 0;
    IVar35 = pIVar26->ActiveId;
  }
  pIVar26->HoveredIdPreviousFrame = IVar42;
  pIVar26->HoveredIdPreviousFrameUsingMouseWheel = pIVar26->HoveredIdUsingMouseWheel;
  pIVar26->HoveredId = 0;
  pIVar26->HoveredIdAllowOverlap = false;
  pIVar26->HoveredIdUsingMouseWheel = false;
  pIVar26->HoveredIdDisabled = false;
  if (((pIVar26->ActiveIdIsAlive != IVar35) && (IVar35 != 0)) &&
     (pIVar26->ActiveIdPreviousFrame == IVar35)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar35 = pIVar26->ActiveId;
  }
  fVar60 = (pIVar26->IO).DeltaTime;
  if (IVar35 != 0) {
    pIVar26->ActiveIdTimer = fVar60 + pIVar26->ActiveIdTimer;
  }
  pIVar26->LastActiveIdTimer = fVar60 + pIVar26->LastActiveIdTimer;
  pIVar26->ActiveIdPreviousFrame = IVar35;
  pIVar26->ActiveIdPreviousFrameWindow = pIVar26->ActiveIdWindow;
  pIVar26->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar26->ActiveIdHasBeenEditedBefore;
  pIVar26->ActiveIdIsAlive = 0;
  pIVar26->ActiveIdHasBeenEditedThisFrame = false;
  pIVar26->ActiveIdPreviousFrameIsAlive = false;
  pIVar26->ActiveIdIsJustActivated = false;
  if (pIVar26->TempInputId == 0) {
LAB_0014fd85:
    if (IVar35 == 0) {
      pIVar26->ActiveIdUsingNavDirMask = 0;
      pIVar26->ActiveIdUsingNavInputMask = 0;
      pIVar26->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar35 != pIVar26->TempInputId) {
    pIVar26->TempInputId = 0;
    goto LAB_0014fd85;
  }
  pIVar26->DragDropAcceptIdPrev = pIVar26->DragDropAcceptIdCurr;
  pIVar26->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar26->DragDropAcceptIdCurr = 0;
  pIVar26->DragDropWithinSource = false;
  pIVar26->DragDropWithinTarget = false;
  pIVar26->DragDropHoldJustPressedId = 0;
  pIVar57 = GImGui;
  bVar29 = (GImGui->IO).KeyCtrl;
  uVar33 = bVar29 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar33 = (uint)bVar29;
  }
  uVar36 = uVar33 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar36 = uVar33;
  }
  uVar33 = uVar36 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar33 = uVar36;
  }
  (pIVar26->IO).KeyMods = uVar33;
  memcpy((pIVar26->IO).KeysDownDurationPrev,(pIVar26->IO).KeysDownDuration,0x800);
  lVar55 = 0x144;
  do {
    fVar61 = -1.0;
    if (*(char *)((long)(pIVar26->IO).KeyMap + lVar55 + -0x3c) == '\x01') {
      fVar6 = *(float *)((long)pIVar26 + lVar55 * 4 + -0x70);
      fVar61 = 0.0;
      if (0.0 <= fVar6) {
        fVar61 = fVar6 + fVar60;
      }
    }
    *(float *)((long)pIVar26 + lVar55 * 4 + -0x70) = fVar61;
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x344);
  (pIVar57->IO).WantSetMousePos = false;
  pIVar57->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar57->NavWrapRequestFlags = 0;
  uVar33 = (pIVar57->IO).ConfigFlags;
  if (((uVar33 & 2) == 0) || (((pIVar57->IO).BackendFlags & 1) == 0)) {
    bVar41 = 0;
  }
  else {
    bVar41 = 1;
    if ((pIVar57->NavInputSource != ImGuiInputSource_NavGamepad) &&
       (((0.0 < (pIVar57->IO).NavInputs[0] || (0.0 < (pIVar57->IO).NavInputs[2])) ||
        ((0.0 < (pIVar57->IO).NavInputs[1] ||
         ((((0.0 < (pIVar57->IO).NavInputs[3] || (0.0 < (pIVar57->IO).NavInputs[4])) ||
           (0.0 < (pIVar57->IO).NavInputs[5])) ||
          ((0.0 < (pIVar57->IO).NavInputs[6] || (0.0 < (pIVar57->IO).NavInputs[7])))))))))) {
      pIVar57->NavInputSource = ImGuiInputSource_NavGamepad;
    }
  }
  if ((uVar33 & 1) != 0) {
    uVar36 = (pIVar57->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar36) {
      if (0x1ff < uVar36) goto LAB_00152969;
      if ((pIVar57->IO).KeysDown[(int)uVar36] == true) {
        (pIVar57->IO).NavInputs[0] = 1.0;
        pIVar57->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar36 = (pIVar57->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar36) {
      if (0x1ff < uVar36) goto LAB_00152969;
      if ((pIVar57->IO).KeysDown[(int)uVar36] == true) {
        (pIVar57->IO).NavInputs[2] = 1.0;
        pIVar57->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar36 = (pIVar57->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar36) {
      if (0x1ff < uVar36) goto LAB_00152969;
      if ((pIVar57->IO).KeysDown[(int)uVar36] == true) {
        (pIVar57->IO).NavInputs[1] = 1.0;
        pIVar57->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar36 = (pIVar57->IO).KeyMap[1];
    if (-1 < (long)(int)uVar36) {
      if (0x1ff < uVar36) goto LAB_00152969;
      if ((pIVar57->IO).KeysDown[(int)uVar36] == true) {
        (pIVar57->IO).NavInputs[0x11] = 1.0;
        pIVar57->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar36 = (pIVar57->IO).KeyMap[2];
    if (-1 < (long)(int)uVar36) {
      if (0x1ff < uVar36) goto LAB_00152969;
      if ((pIVar57->IO).KeysDown[(int)uVar36] == true) {
        (pIVar57->IO).NavInputs[0x12] = 1.0;
        pIVar57->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar36 = (pIVar57->IO).KeyMap[3];
    if (-1 < (long)(int)uVar36) {
      if (0x1ff < uVar36) goto LAB_00152969;
      if ((pIVar57->IO).KeysDown[(int)uVar36] == true) {
        (pIVar57->IO).NavInputs[0x13] = 1.0;
        pIVar57->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar36 = (pIVar57->IO).KeyMap[4];
    if (-1 < (long)(int)uVar36) {
      if (0x1ff < uVar36) {
LAB_00152969:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                      ,0x11dd,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar57->IO).KeysDown[(int)uVar36] == true) {
        (pIVar57->IO).NavInputs[0x14] = 1.0;
        pIVar57->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar29 = (pIVar57->IO).KeyCtrl;
    if (bVar29 == true) {
      (pIVar57->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar57->IO).KeyShift == true) {
      (pIVar57->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar29 == false) && ((pIVar57->IO).KeyAlt != false)) {
      (pIVar57->IO).NavInputs[0x10] = 1.0;
    }
  }
  uVar62 = *(undefined8 *)(pIVar57->IO).NavInputsDownDuration;
  uVar85 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 2);
  uVar17 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 4);
  uVar18 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 6);
  uVar19 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 8);
  uVar20 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 10);
  uVar21 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 0xc);
  uVar22 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 0xe);
  uVar23 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 0xf);
  uVar24 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 0x11);
  uVar25 = *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 0x13);
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 0xd) =
       *(undefined8 *)((pIVar57->IO).NavInputsDownDuration + 0xd);
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 0xf) = uVar23;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 0x11) = uVar24;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 0x13) = uVar25;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 8) = uVar19;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 10) = uVar20;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 0xc) = uVar21;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 0xe) = uVar22;
  *(undefined8 *)(pIVar57->IO).NavInputsDownDurationPrev = uVar62;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 2) = uVar85;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 4) = uVar17;
  *(undefined8 *)((pIVar57->IO).NavInputsDownDurationPrev + 6) = uVar18;
  lVar55 = 0;
  do {
    fVar60 = -1.0;
    if (0.0 < (pIVar57->IO).NavInputs[lVar55]) {
      fVar61 = (pIVar57->IO).NavInputsDownDuration[lVar55];
      fVar60 = 0.0;
      if (0.0 <= fVar61) {
        fVar60 = fVar61 + (pIVar57->IO).DeltaTime;
      }
    }
    (pIVar57->IO).NavInputsDownDuration[lVar55] = fVar60;
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x15);
  IVar42 = pIVar57->NavInitResultId;
  if ((IVar42 != 0) &&
     (((pIVar57->NavDisableHighlight != true || (pIVar57->NavInitRequestFromMove == true)) &&
      (pIVar57->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar49 = pIVar57->NavLayer;
    if (pIVar57->NavInitRequestFromMove == true) {
      SetNavID(IVar42,IVar49,0);
      IVar63 = (pIVar57->NavInitResultRectRel).Max;
      pIVar4 = &pIVar57->NavWindow->NavRectRel[(int)IVar49].Min;
      *pIVar4 = (pIVar57->NavInitResultRectRel).Min;
      pIVar4[1] = IVar63;
      pIVar57->NavMousePosDirty = true;
      pIVar57->NavDisableHighlight = false;
      pIVar57->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar42,IVar49,0);
    }
    IVar63 = (pIVar57->NavInitResultRectRel).Max;
    pIVar4 = &pIVar57->NavWindow->NavRectRel[pIVar57->NavLayer].Min;
    *pIVar4 = (pIVar57->NavInitResultRectRel).Min;
    pIVar4[1] = IVar63;
  }
  pIVar57->NavInitRequest = false;
  pIVar57->NavInitRequestFromMove = false;
  pIVar57->NavInitResultId = 0;
  pIVar57->NavJustMovedToId = 0;
  pIVar27 = GImGui;
  if (pIVar57->NavMoveRequest == true) {
    IVar42 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar42 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      pIVar59 = GImGui;
      if (GImGui->NavId == 0) goto LAB_00150494;
    }
    else {
      pIVar1 = &GImGui->NavMoveResultOther;
      pIVar53 = &GImGui->NavMoveResultLocal;
      if (IVar42 == 0) {
        pIVar53 = pIVar1;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar42 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar42 != 0)) &&
         (IVar42 != GImGui->NavId)) {
        pIVar53 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar53 == pIVar1) {
LAB_0015035a:
        pIVar53 = pIVar1;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar60 = (GImGui->NavMoveResultOther).DistBox;
        fVar61 = pIVar53->DistBox;
        if (fVar61 <= fVar60) {
          if (((fVar60 != fVar61) || (NAN(fVar60) || NAN(fVar61))) ||
             (pIVar53->DistCenter <= (GImGui->NavMoveResultOther).DistCenter)) goto LAB_0015035d;
        }
        goto LAB_0015035a;
      }
LAB_0015035d:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar38 = pIVar53->Window, pIVar38 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                      ,0x23fe,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar63 = (pIVar53->RectRel).Min;
          IVar7 = (pIVar53->RectRel).Max;
          fVar60 = (pIVar38->Pos).x;
          auVar86._0_4_ = IVar63.x + fVar60;
          fVar61 = (pIVar38->Pos).y;
          auVar86._4_4_ = IVar63.y + fVar61;
          auVar86._8_8_ = 0;
          auVar67._0_4_ = fVar60 + IVar7.x;
          auVar67._4_4_ = fVar61 + IVar7.y;
          auVar67._8_8_ = 0;
          local_40 = (ImRect)vmovlhps_avx(auVar86,auVar67);
          IVar63 = ScrollToBringRectIntoView(pIVar53->Window,&local_40);
        }
        else {
          fVar60 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar60 = (pIVar38->ScrollMax).y;
          }
          auVar68 = ZEXT416((uint)((pIVar38->Scroll).y - fVar60));
          auVar68 = vinsertps_avx(auVar68,auVar68,0x1d);
          IVar63 = auVar68._0_8_;
          (pIVar38->ScrollTarget).y = fVar60;
          (pIVar38->ScrollTargetCenterRatio).y = 0.0;
          (pIVar38->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        auVar69._8_4_ = IVar63.x;
        auVar69._12_4_ = IVar63.y;
        auVar69._0_4_ = IVar63.x;
        auVar69._4_4_ = IVar63.y;
        IVar74 = (ImRect)vsubps_avx((undefined1  [16])pIVar53->RectRel,auVar69);
        pIVar53->RectRel = IVar74;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar27->NavWindow = pIVar53->Window;
      IVar42 = pIVar53->ID;
      if (pIVar27->NavId == IVar42) {
        IVar35 = pIVar53->FocusScopeId;
      }
      else {
        pIVar27->NavJustMovedToId = IVar42;
        IVar35 = pIVar53->FocusScopeId;
        pIVar27->NavJustMovedToFocusScopeId = IVar35;
        pIVar27->NavJustMovedToKeyMods = pIVar27->NavMoveRequestKeyMods;
      }
      pIVar59 = GImGui;
      IVar49 = pIVar27->NavLayer;
      SetNavID(IVar42,IVar49,IVar35);
      IVar63 = (pIVar53->RectRel).Max;
      pIVar4 = &pIVar59->NavWindow->NavRectRel[(int)IVar49].Min;
      *pIVar4 = (pIVar53->RectRel).Min;
      pIVar4[1] = IVar63;
      pIVar59->NavMousePosDirty = true;
    }
    pIVar59->NavDisableHighlight = false;
    pIVar59->NavDisableMouseHover = true;
  }
LAB_00150494:
  if (pIVar57->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar57->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x22fa,"void ImGui::NavUpdate()");
    }
    if (((pIVar57->NavMoveResultLocal).ID == 0) && ((pIVar57->NavMoveResultOther).ID == 0)) {
      pIVar57->NavDisableHighlight = false;
    }
    pIVar57->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar57->NavMousePosDirty == true) && (pIVar57->NavIdIsAlive == true)) {
    if ((((pIVar57->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar57->IO).BackendFlags & 4) != 0 && (pIVar57->NavDisableHighlight == false)) &&
         (pIVar57->NavDisableMouseHover == true)) && (pIVar57->NavWindow != (ImGuiWindow *)0x0)))) {
      auVar82._0_8_ = NavCalcPreferredRefPos();
      auVar82._8_56_ = extraout_var;
      IVar63 = (ImVec2)vmovlps_avx(auVar82._0_16_);
      (pIVar57->IO).MousePosPrev = IVar63;
      IVar63 = (ImVec2)vmovlps_avx(auVar82._0_16_);
      (pIVar57->IO).MousePos = IVar63;
      (pIVar57->IO).WantSetMousePos = true;
    }
    pIVar57->NavMousePosDirty = false;
  }
  pIVar57->NavIdIsAlive = false;
  pIVar57->NavJustTabbedId = 0;
  IVar49 = pIVar57->NavLayer;
  if (ImGuiNavLayer_Menu < IVar49) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x2310,"void ImGui::NavUpdate()");
  }
  pIVar38 = pIVar57->NavWindow;
  pIVar44 = pIVar38;
  if (pIVar38 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar44->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar44 != pIVar38) {
          pIVar44->NavLastChildNavWindow = pIVar38;
        }
        break;
      }
      ppIVar13 = &pIVar44->ParentWindow;
      pIVar44 = *ppIVar13;
    } while (*ppIVar13 != (ImGuiWindow *)0x0);
    if ((IVar49 == ImGuiNavLayer_Main) && (pIVar38->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar38->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar27 = GImGui;
  pIVar38 = GetTopMostPopupModal();
  if (pIVar38 != (ImGuiWindow *)0x0) {
    pIVar27->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar27->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar27->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    auVar70._0_12_ = ZEXT812(0);
    auVar70._12_4_ = 0;
    auVar65 = ZEXT416((uint)((pIVar27->IO).DeltaTime * -10.0 + pIVar27->NavWindowingHighlightAlpha))
    ;
    auVar68 = vcmpss_avx(auVar70,auVar65,2);
    auVar68 = vandps_avx(auVar68,auVar65);
    pIVar27->NavWindowingHighlightAlpha = auVar68._0_4_;
    if ((pIVar27->DimBgRatio <= 0.0) && (auVar68._0_4_ <= 0.0)) {
      pIVar27->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar38 == (ImGuiWindow *)0x0) && (pIVar27->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar60 = (pIVar27->IO).NavInputsDownDuration[3];
    if (((pIVar27->IO).KeyCtrl == true) &&
       ((iVar45 = (pIVar27->IO).KeyMap[0], -1 < iVar45 &&
        (bVar29 = IsKeyPressed(iVar45,true), bVar29)))) {
      bVar8 = (byte)(pIVar27->IO).ConfigFlags;
      uVar36 = (uint)bVar8;
      if (fVar60 == 0.0 || (bVar8 & 1) != 0) {
LAB_001506cd:
        pIVar38 = pIVar27->NavWindow;
        if ((pIVar38 != (ImGuiWindow *)0x0) ||
           (pIVar38 = FindWindowNavFocusable((pIVar27->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar38 != (ImGuiWindow *)0x0)) {
          pIVar38 = pIVar38->RootWindow;
          pIVar27->NavWindowingTargetAnim = pIVar38;
          pIVar27->NavWindowingTarget = pIVar38;
          pIVar27->NavWindowingTimer = 0.0;
          pIVar27->NavWindowingHighlightAlpha = 0.0;
          pIVar27->NavWindowingToggleLayer = (bool)(~(byte)uVar36 & 1);
          pIVar27->NavInputSource = ImGuiInputSource_NavGamepad - (uVar36 & 1);
        }
      }
    }
    else if ((fVar60 == 0.0) && (!NAN(fVar60))) {
      uVar36 = 0;
      goto LAB_001506cd;
    }
  }
  auVar68 = SUB6416(ZEXT464(0x3f800000),0);
  fVar60 = (pIVar27->IO).DeltaTime + pIVar27->NavWindowingTimer;
  pIVar27->NavWindowingTimer = fVar60;
  if (pIVar27->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_001508ee:
    bVar29 = false;
    pIVar38 = (ImGuiWindow *)0x0;
  }
  else {
    IVar37 = pIVar27->NavInputSource;
    if (IVar37 != ImGuiInputSource_NavGamepad) {
LAB_0015085f:
      if (IVar37 == ImGuiInputSource_NavKeyboard) {
        auVar72._0_4_ = (pIVar27->NavWindowingTimer + -0.2) / 0.05;
        auVar72._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar65 = vminss_avx(auVar68,auVar72);
        auVar68 = vcmpss_avx(auVar72,ZEXT816(0) << 0x40,1);
        auVar68 = vandnps_avx(auVar68,auVar65);
        auVar65 = vcmpss_avx(auVar68,ZEXT416((uint)pIVar27->NavWindowingHighlightAlpha),2);
        auVar68 = vblendvps_avx(auVar68,ZEXT416((uint)pIVar27->NavWindowingHighlightAlpha),auVar65);
        pIVar27->NavWindowingHighlightAlpha = auVar68._0_4_;
        iVar45 = (GImGui->IO).KeyMap[0];
        if ((-1 < iVar45) && (bVar29 = IsKeyPressed(iVar45,true), bVar29)) {
          NavUpdateWindowingHighlightWindow((pIVar27->IO).KeyShift - 1 | 1);
        }
        if ((pIVar27->IO).KeyCtrl == false) {
          pIVar38 = pIVar27->NavWindowingTarget;
          bVar29 = false;
          goto LAB_001508f3;
        }
      }
      goto LAB_001508ee;
    }
    auVar71._0_4_ = (fVar60 + -0.2) / 0.05;
    auVar71._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar65 = vminss_avx(auVar68,auVar71);
    auVar68 = vcmpss_avx(auVar71,ZEXT816(0),1);
    auVar68 = vandnps_avx(auVar68,auVar65);
    auVar65 = vcmpss_avx(auVar68,ZEXT416((uint)pIVar27->NavWindowingHighlightAlpha),2);
    auVar65 = vblendvps_avx(auVar68,ZEXT416((uint)pIVar27->NavWindowingHighlightAlpha),auVar65);
    pIVar27->NavWindowingHighlightAlpha = auVar65._0_4_;
    fVar60 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar61 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar45 = (uint)(0.0 < fVar60) - (uint)(0.0 < fVar61);
    if (iVar45 == 0) {
      auVar68 = SUB6416(ZEXT464(0x3f800000),0);
    }
    else {
      NavUpdateWindowingHighlightWindow(iVar45);
      pIVar27->NavWindowingHighlightAlpha = 1.0;
      auVar65 = SUB6416(ZEXT464(0x3f800000),0);
      auVar68 = auVar65;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar27->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_001508ee;
      IVar37 = pIVar27->NavInputSource;
      goto LAB_0015085f;
    }
    pbVar56 = &pIVar27->NavWindowingToggleLayer;
    *pbVar56 = (bool)(*pbVar56 & auVar65._0_4_ < 1.0);
    if (*pbVar56 == false) {
      pIVar38 = pIVar27->NavWindowingTarget;
      bVar29 = false;
    }
    else {
      bVar29 = pIVar27->NavWindow != (ImGuiWindow *)0x0;
      pIVar38 = (ImGuiWindow *)0x0;
    }
    pIVar27->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_001508f3:
  pIVar59 = GImGui;
  fVar60 = (GImGui->IO).NavInputsDownDuration[0x10];
  if ((fVar60 == 0.0) && (!NAN(fVar60))) {
    pIVar27->NavWindowingToggleLayer = true;
  }
  if ((((pIVar27->ActiveId == 0) || (pIVar27->ActiveIdAllowOverlap == true)) && (fVar60 < 0.0)) &&
     ((pIVar27->NavWindowingToggleLayer != false &&
      (0.0 <= (pIVar59->IO).NavInputsDownDurationPrev[0x10])))) {
    bVar30 = IsMousePosValid(&(pIVar27->IO).MousePos);
    bVar31 = IsMousePosValid(&(pIVar27->IO).MousePosPrev);
    bVar29 = (bool)(bVar31 == bVar30 | bVar29);
  }
  pIVar44 = pIVar27->NavWindowingTarget;
  if ((pIVar44 != (ImGuiWindow *)0x0) && ((pIVar44->Flags & 4) == 0)) {
    IVar37 = pIVar27->NavInputSource;
    if ((IVar37 == ImGuiInputSource_NavGamepad) ||
       ((auVar68 = ZEXT816(0) << 0x40, IVar37 == ImGuiInputSource_NavKeyboard &&
        (IVar37 = ImGuiInputSource_Mouse, (pIVar27->IO).KeyShift == false)))) {
      auVar83._0_8_ = GetNavInputAmount2d(IVar37,ImGuiInputReadMode_Down,0.0,0.0);
      auVar83._8_56_ = extraout_var_00;
      auVar68 = auVar83._0_16_;
    }
    if (auVar68._0_4_ == 0.0) {
      auVar65 = vmovshdup_avx(auVar68);
      if ((auVar65._0_4_ == 0.0) && (!NAN(auVar65._0_4_))) goto LAB_00150a6c;
    }
    auVar65 = vminss_avx(ZEXT416((uint)(pIVar27->IO).DisplayFramebufferScale.x),
                         ZEXT416((uint)(pIVar27->IO).DisplayFramebufferScale.y));
    auVar65 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar27->IO).DeltaTime * 800.0 * auVar65._0_4_)));
    pIVar44 = pIVar44->RootWindow;
    fVar60 = auVar65._0_4_;
    auVar73._0_4_ = (pIVar44->Pos).x + auVar68._0_4_ * fVar60;
    auVar73._4_4_ = (pIVar44->Pos).y + auVar68._4_4_ * fVar60;
    auVar73._8_4_ = auVar68._8_4_ * fVar60 + 0.0;
    auVar73._12_4_ = auVar68._12_4_ * fVar60 + 0.0;
    IVar63 = (ImVec2)vmovlps_avx(auVar73);
    local_40.Min = IVar63;
    SetWindowPos(pIVar44,&local_40.Min,1);
    if (((pIVar44->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
      GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
    }
    pIVar27->NavDisableMouseHover = true;
  }
LAB_00150a6c:
  if (pIVar38 != (ImGuiWindow *)0x0) {
    if ((pIVar27->NavWindow == (ImGuiWindow *)0x0) || (pIVar38 != pIVar27->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar27->NavDisableHighlight = false;
      pIVar27->NavDisableMouseHover = true;
      pIVar44 = pIVar38->NavLastChildNavWindow;
      if ((pIVar44 == (ImGuiWindow *)0x0) || (pIVar44->WasActive == false)) {
        pIVar44 = pIVar38;
      }
      ClosePopupsOverWindow(pIVar44,false);
      FocusWindow(pIVar44);
      if (pIVar44->NavLastIds[0] == 0) {
        NavInitWindow(pIVar44,false);
      }
      if ((pIVar44->DC).NavLayerActiveMask == 2) {
        pIVar27->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar27->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar29) && (pIVar38 = pIVar27->NavWindow, pIVar44 = pIVar38, pIVar38 != (ImGuiWindow *)0x0))
  {
    while (window = pIVar44, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar44 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar38) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar38;
      pIVar38 = pIVar27->NavWindow;
    }
    pIVar27->NavDisableHighlight = false;
    pIVar27->NavDisableMouseHover = true;
    IVar49 = ImGuiNavLayer_Main;
    if (((pIVar38->DC).NavLayerActiveMask & 2) != 0) {
      IVar49 = pIVar27->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar49);
  }
  if (((bool)((uVar33 & 1) == 0 & (bVar41 ^ 1))) || (pIVar57->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar57->IO).NavActive = false;
LAB_00150be3:
    bVar29 = pIVar57->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar29 = (pIVar57->NavWindow->Flags & 0x40000U) == 0;
    (pIVar57->IO).NavActive = bVar29;
    if (((!bVar29) || (pIVar57->NavId == 0)) ||
       (bVar29 = true, pIVar57->NavDisableHighlight != false)) goto LAB_00150be3;
  }
  (pIVar57->IO).NavVisible = bVar29;
  fVar60 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar60 == 0.0) && (!NAN(fVar60))) {
    if (pIVar57->ActiveId == 0) {
      pIVar38 = pIVar57->NavWindow;
      if (((pIVar38 == (ImGuiWindow *)0x0) || ((pIVar38->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar38->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar45 = (pIVar57->OpenPopupStack).Size;
        if ((long)iVar45 < 1) {
          if (pIVar57->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar38 != (ImGuiWindow *)0x0) && ((pIVar38->Flags & 0x5000000U) != 0x1000000)) {
              pIVar38->NavLastIds[0] = 0;
            }
            pIVar57->NavId = 0;
            pIVar57->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar57->OpenPopupStack).Data[(long)iVar45 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar45 + -1,true);
        }
      }
      else {
        if (pIVar38->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                        ,0x232d,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar38->ParentWindow);
        pIVar27 = GImGui;
        pIVar44 = GImGui->NavWindow;
        if (pIVar44 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                        ,0x210c,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar42 = pIVar38->ChildId;
        GImGui->NavId = IVar42;
        pIVar27->NavFocusScopeId = 0;
        pIVar44->NavLastIds[0] = IVar42;
        pIVar57->NavIdIsAlive = false;
        if (pIVar57->NavDisableMouseHover == true) {
          pIVar57->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar57->NavActivateId = 0;
  pIVar57->NavActivateDownId = 0;
  pIVar57->NavActivatePressedId = 0;
  pIVar27 = GImGui;
  pIVar57->NavInputId = 0;
  IVar42 = pIVar57->NavId;
  IVar35 = 0;
  if ((IVar42 == 0) || (pIVar57->NavDisableHighlight != false)) {
    IVar48 = 0;
LAB_00150df1:
    pIVar38 = pIVar57->NavWindow;
    bVar29 = pIVar38 == (ImGuiWindow *)0x0;
    if ((!bVar29) && ((pIVar38->Flags & 0x40000) != 0)) {
      pIVar57->NavDisableHighlight = true;
    }
    if (IVar35 != IVar48 && IVar48 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x235b,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar48 = 0;
    if (pIVar57->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00150df1;
    IVar35 = 0;
    if (pIVar57->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar57->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar60 = (GImGui->IO).NavInputsDownDuration[0];
          IVar28 = IVar42;
          if (0.0 <= fVar60) {
            IVar50 = pIVar57->ActiveId;
            if (IVar50 == 0 && fVar60 == 0.0) {
              pIVar57->NavActivateId = IVar42;
              pIVar57->NavActivateDownId = IVar42;
              IVar48 = IVar42;
            }
            else {
              if (IVar50 == 0) {
                pIVar57->NavActivateDownId = IVar42;
              }
              else {
                if (IVar50 != IVar42) goto LAB_00151291;
                pIVar57->NavActivateDownId = IVar42;
              }
              IVar48 = 0;
              if ((fVar60 != 0.0) || (IVar48 = 0, NAN(fVar60))) goto LAB_00152605;
            }
            pIVar57->NavActivatePressedId = IVar42;
          }
          else {
            IVar50 = pIVar57->ActiveId;
            if ((IVar50 != 0) && (IVar50 != IVar42)) goto LAB_00151291;
            pIVar57->NavActivateDownId = IVar42;
            IVar48 = 0;
          }
        }
        else {
          IVar50 = pIVar57->ActiveId;
          if (IVar50 == 0) {
            IVar48 = 0;
            IVar28 = 0;
          }
          else {
LAB_00151291:
            IVar35 = 0;
            IVar48 = 0;
            IVar28 = 0;
            if (IVar50 != IVar42) goto LAB_00150df1;
          }
        }
LAB_00152605:
        IVar35 = IVar28;
        fVar60 = (pIVar27->IO).NavInputsDownDuration[2];
        if ((fVar60 == 0.0) && (!NAN(fVar60))) {
          pIVar57->NavInputId = IVar42;
        }
      }
      goto LAB_00150df1;
    }
    bVar29 = true;
    pIVar38 = (ImGuiWindow *)0x0;
  }
  pIVar57->NavMoveRequest = false;
  IVar42 = pIVar57->NavNextActivateId;
  if (IVar42 != 0) {
    pIVar57->NavActivateId = IVar42;
    pIVar57->NavActivateDownId = IVar42;
    pIVar57->NavActivatePressedId = IVar42;
    pIVar57->NavInputId = IVar42;
  }
  pIVar57->NavNextActivateId = 0;
  if (pIVar57->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar57->NavMoveDir = -1;
    pIVar57->NavMoveRequestFlags = 0;
    IVar46 = -1;
    if (((!bVar29) && (pIVar57->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar38->Flags & 0x40000) == 0)) {
      uVar36 = GImGui->ActiveIdUsingNavDirMask;
      IVar46 = -1;
      if (((uVar36 & 1) == 0) &&
         ((fVar60 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar60 ||
          (fVar60 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar60)))) {
        pIVar57->NavMoveDir = 0;
        IVar46 = 0;
      }
      if (((uVar36 & 2) == 0) &&
         ((fVar60 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar60 ||
          (fVar60 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar60)))) {
        pIVar57->NavMoveDir = 1;
        IVar46 = 1;
      }
      if (((uVar36 & 4) == 0) &&
         ((fVar60 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar60 ||
          (fVar60 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar60)))) {
        pIVar57->NavMoveDir = 2;
        IVar46 = 2;
      }
      if (((uVar36 & 8) == 0) &&
         ((fVar60 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar60 ||
          (fVar60 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar60)))) {
        pIVar57->NavMoveDir = 3;
        IVar46 = 3;
      }
    }
    pIVar57->NavMoveClipDir = IVar46;
  }
  else {
    if ((pIVar57->NavMoveDir == -1) || (pIVar57->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2376,"void ImGui::NavUpdate()");
    }
    if (pIVar57->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2377,"void ImGui::NavUpdate()");
    }
    pIVar57->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar27 = GImGui;
  local_78 = 0.0;
  if ((((((uVar33 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar38 = GImGui->NavWindow, pIVar38 != (ImGuiWindow *)0x0)) &&
      (((pIVar38->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar29 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar30 = false;
    bVar31 = false;
    if (bVar29) {
      bVar31 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar29 = IsKeyDown((pIVar27->IO).KeyMap[6]);
    if (bVar29) {
      bVar30 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar29 = IsKeyPressed((pIVar27->IO).KeyMap[7],true);
    if (bVar29) {
      bVar29 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar29 = false;
    }
    bVar32 = IsKeyPressed((pIVar27->IO).KeyMap[8],true);
    if (bVar32) {
      bVar32 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar32 = false;
    }
    local_78 = 0.0;
    if ((bVar31 != bVar30) || (bVar29 != bVar32)) {
      if (((pIVar38->DC).NavLayerActiveMask == 0) && ((pIVar38->DC).NavHasScroll == true)) {
        bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[5],true);
        if (bVar30) {
          fVar60 = (pIVar38->Scroll).y - ((pIVar38->InnerRect).Max.y - (pIVar38->InnerRect).Min.y);
LAB_001528c5:
          (pIVar38->ScrollTarget).y = fVar60;
        }
        else {
          bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[6],true);
          if (bVar30) {
            fVar60 = ((pIVar38->InnerRect).Max.y - (pIVar38->InnerRect).Min.y) + (pIVar38->Scroll).y
            ;
            goto LAB_001528c5;
          }
          if (bVar29 == false) {
            if (bVar32 == false) goto LAB_001528d8;
            fVar60 = (pIVar38->ScrollMax).y;
            goto LAB_001528c5;
          }
          (pIVar38->ScrollTarget).y = 0.0;
        }
        (pIVar38->ScrollTargetCenterRatio).y = 0.0;
        (pIVar38->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_001528d8:
        local_78 = 0.0;
      }
      else {
        IVar49 = pIVar27->NavLayer;
        pIVar47 = pIVar38->NavRectRel + IVar49;
        fVar60 = GImGui->FontBaseSize * pIVar38->FontWindowScale;
        if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
          fVar60 = fVar60 * pIVar38->ParentWindow->FontWindowScale;
        }
        auVar98._0_12_ = ZEXT812(0);
        auVar98._12_4_ = 0;
        auVar65 = ZEXT416((uint)((((pIVar38->InnerRect).Max.y - (pIVar38->InnerRect).Min.y) - fVar60
                                 ) + (pIVar38->NavRectRel[IVar49].Max.y -
                                     pIVar38->NavRectRel[IVar49].Min.y)));
        auVar68 = vcmpss_avx(auVar65,auVar98,2);
        auVar68 = vandnps_avx(auVar68,auVar65);
        bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[5],true);
        local_78 = auVar68._0_4_;
        if (bVar30) {
          local_78 = -local_78;
          pIVar27->NavMoveDir = 3;
          pIVar27->NavMoveClipDir = 2;
          pIVar27->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[6],true);
          if (!bVar30) {
            if (bVar29 == false) {
              local_78 = 0.0;
              if (bVar32 != false) {
                fVar60 = ((pIVar38->ScrollMax).y + (pIVar38->SizeFull).y) - (pIVar38->Scroll).y;
                pIVar38->NavRectRel[IVar49].Max.y = fVar60;
                pIVar38->NavRectRel[IVar49].Min.y = fVar60;
                if (pIVar38->NavRectRel[IVar49].Max.x < (pIVar47->Min).x) {
                  pIVar38->NavRectRel[IVar49].Max.x = 0.0;
                  (pIVar47->Min).x = 0.0;
                }
                pIVar27->NavMoveDir = 2;
                pIVar27->NavMoveRequestFlags = 0x50;
              }
              goto LAB_00151028;
            }
            fVar60 = -(pIVar38->Scroll).y;
            pIVar38->NavRectRel[IVar49].Max.y = fVar60;
            pIVar38->NavRectRel[IVar49].Min.y = fVar60;
            if (pIVar38->NavRectRel[IVar49].Max.x < (pIVar47->Min).x) {
              pIVar38->NavRectRel[IVar49].Max.x = 0.0;
              (pIVar47->Min).x = 0.0;
            }
            pIVar27->NavMoveDir = 3;
            pIVar27->NavMoveRequestFlags = 0x50;
            goto LAB_001528d8;
          }
          pIVar27->NavMoveDir = 2;
          pIVar27->NavMoveClipDir = 3;
          pIVar27->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_00151028:
  uVar33 = pIVar57->NavMoveDir;
  if (uVar33 == 0xffffffff) {
    bVar41 = pIVar57->NavMoveRequest;
    if ((bVar41 & 1) != 0) goto LAB_0015106b;
    bVar29 = false;
  }
  else {
    pIVar57->NavMoveRequest = true;
    pIVar57->NavMoveRequestKeyMods = (pIVar57->IO).KeyMods;
    pIVar57->NavMoveDirLast = uVar33;
    bVar41 = 1;
LAB_0015106b:
    bVar29 = true;
    if (pIVar57->NavId == 0) {
      pIVar57->NavInitRequest = true;
      pIVar57->NavInitRequestFromMove = true;
      pIVar57->NavInitResultId = 0;
      pIVar57->NavDisableHighlight = false;
    }
  }
  pIVar27 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar56 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar56;
    if (*pbVar56 != false) goto LAB_00151189;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_00151189:
    if (pIVar27->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2266,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar38 = pIVar57->NavWindow;
  if (((pIVar38 != (ImGuiWindow *)0x0) && ((pIVar38->Flags & 0x40000) == 0)) &&
     (pIVar57->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar60 = pIVar27->FontBaseSize * pIVar38->FontWindowScale;
    if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
      fVar60 = fVar60 * pIVar38->ParentWindow->FontWindowScale;
    }
    auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar60 * 100.0 * (pIVar57->IO).DeltaTime + 0.5)));
    fVar60 = auVar68._0_4_;
    if (((pIVar38->DC).NavLayerActiveMask == 0) && ((bVar41 & (pIVar38->DC).NavHasScroll) == 1)) {
      if (uVar33 < 2) {
        lVar55 = 0x7c;
        lVar58 = 0x74;
        lVar51 = 0x6c;
        lVar52 = 0x5c;
        uVar36 = 0;
      }
      else {
        if ((uVar33 & 0xfffffffe) != 2) goto LAB_00151337;
        lVar55 = 0x80;
        lVar58 = 0x78;
        lVar51 = 0x70;
        uVar36 = 2;
        lVar52 = 0x60;
      }
      auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar60 * *(float *)(&DAT_001e8cb0 +
                                                                     (ulong)(uVar33 == uVar36) * 4)
                                                 + *(float *)((long)&pIVar38->Name + lVar52))));
      *(int *)((long)&pIVar38->Name + lVar51) = auVar68._0_4_;
      *(undefined4 *)((long)&pIVar38->Name + lVar58) = 0;
      *(undefined4 *)((long)&pIVar38->Name + lVar55) = 0;
    }
LAB_00151337:
    auVar84._0_8_ = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    auVar84._8_56_ = extraout_var_01;
    fVar61 = auVar84._0_4_;
    if (((fVar61 != 0.0) || (NAN(fVar61))) && (pIVar38->ScrollbarX == true)) {
      auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar61 * fVar60 + (pIVar38->Scroll).x)));
      (pIVar38->ScrollTarget).x = auVar68._0_4_;
      (pIVar38->ScrollTargetCenterRatio).x = 0.0;
      (pIVar38->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    auVar68 = vmovshdup_avx(auVar84._0_16_);
    fVar61 = auVar68._0_4_;
    if ((fVar61 != 0.0) || (NAN(fVar61))) {
      auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar61 * fVar60 + (pIVar38->Scroll).y)));
      (pIVar38->ScrollTarget).y = auVar68._0_4_;
      (pIVar38->ScrollTargetCenterRatio).y = 0.0;
      (pIVar38->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  IVar74 = (ImRect)(ZEXT816(0) << 0x40);
  (pIVar57->NavMoveResultLocal).Window = (ImGuiWindow *)IVar74.Min;
  (pIVar57->NavMoveResultLocal).ID = (ImGuiID)IVar74.Max.x;
  (pIVar57->NavMoveResultLocal).FocusScopeId = (ImGuiID)IVar74.Max.y;
  (pIVar57->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  auVar87._8_4_ = 0x7f7fffff;
  auVar87._0_8_ = 0x7f7fffff7f7fffff;
  auVar87._12_4_ = 0x7f7fffff;
  uVar62 = vmovlps_avx(auVar87);
  (pIVar57->NavMoveResultLocal).DistBox = (float)(int)uVar62;
  (pIVar57->NavMoveResultLocal).DistCenter = (float)(int)((ulong)uVar62 >> 0x20);
  (pIVar57->NavMoveResultLocal).RectRel = IVar74;
  (pIVar57->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)IVar74.Min;
  (pIVar57->NavMoveResultLocalVisibleSet).ID = (ImGuiID)IVar74.Max.x;
  (pIVar57->NavMoveResultLocalVisibleSet).FocusScopeId = (ImGuiID)IVar74.Max.y;
  (pIVar57->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  uVar62 = vmovlps_avx(auVar87);
  (pIVar57->NavMoveResultLocalVisibleSet).DistBox = (float)(int)uVar62;
  (pIVar57->NavMoveResultLocalVisibleSet).DistCenter = (float)(int)((ulong)uVar62 >> 0x20);
  (pIVar57->NavMoveResultLocalVisibleSet).RectRel = IVar74;
  (pIVar57->NavMoveResultOther).Window = (ImGuiWindow *)IVar74.Min;
  (pIVar57->NavMoveResultOther).ID = (ImGuiID)IVar74.Max.x;
  (pIVar57->NavMoveResultOther).FocusScopeId = (ImGuiID)IVar74.Max.y;
  (pIVar57->NavMoveResultOther).DistAxial = 3.4028235e+38;
  uVar62 = vmovlps_avx(auVar87);
  (pIVar57->NavMoveResultOther).DistBox = (float)(int)uVar62;
  (pIVar57->NavMoveResultOther).DistCenter = (float)(int)((ulong)uVar62 >> 0x20);
  (pIVar57->NavMoveResultOther).RectRel = IVar74;
  if (((bVar29) && (pIVar57->NavInputSource == ImGuiInputSource_NavGamepad)) &&
     (pIVar57->NavLayer == ImGuiNavLayer_Main)) {
    auVar99._8_8_ = 0;
    auVar99._0_4_ = (pIVar38->Pos).x;
    auVar99._4_4_ = (pIVar38->Pos).y;
    auVar88._8_8_ = 0;
    auVar88._0_4_ = (pIVar38->InnerRect).Min.x;
    auVar88._4_4_ = (pIVar38->InnerRect).Min.y;
    auVar68 = vsubps_avx(auVar88,auVar99);
    auVar106._0_4_ = auVar68._0_4_ + -1.0;
    auVar106._4_4_ = auVar68._4_4_ + -1.0;
    auVar106._8_4_ = auVar68._8_4_ + -1.0;
    auVar106._12_4_ = auVar68._12_4_ + -1.0;
    auVar89._8_8_ = 0;
    auVar89._0_4_ = (pIVar38->InnerRect).Max.x;
    auVar89._4_4_ = (pIVar38->InnerRect).Max.y;
    auVar68 = vsubps_avx(auVar89,auVar99);
    auVar109._0_4_ = auVar68._0_4_ + 1.0;
    auVar109._4_4_ = auVar68._4_4_ + 1.0;
    auVar109._8_4_ = auVar68._8_4_ + 1.0;
    auVar109._12_4_ = auVar68._12_4_ + 1.0;
    fVar60 = pIVar38->NavRectRel[0].Min.x;
    if (((fVar60 < auVar106._0_4_) ||
        (auVar68 = vmovshdup_avx(auVar106), pIVar38->NavRectRel[0].Min.y < auVar68._0_4_)) ||
       ((auVar109._0_4_ < pIVar38->NavRectRel[0].Max.x ||
        (auVar68 = vmovshdup_avx(auVar109), auVar68._0_4_ < pIVar38->NavRectRel[0].Max.y)))) {
      fVar61 = pIVar27->FontBaseSize * pIVar38->FontWindowScale;
      if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
        fVar61 = fVar61 * pIVar38->ParentWindow->FontWindowScale;
      }
      fVar61 = fVar61 * 0.5;
      auVar68 = vsubps_avx(auVar109,auVar106);
      auVar100._4_4_ = fVar61;
      auVar100._0_4_ = fVar61;
      auVar100._8_4_ = fVar61;
      auVar100._12_4_ = fVar61;
      auVar68 = vminps_avx(auVar68,auVar100);
      auVar107._0_4_ = auVar106._0_4_ + auVar68._0_4_;
      auVar107._4_4_ = auVar106._4_4_ + auVar68._4_4_;
      auVar107._8_4_ = auVar106._8_4_ + auVar68._8_4_;
      auVar107._12_4_ = auVar106._12_4_ + auVar68._12_4_;
      auVar67 = vsubps_avx(auVar109,auVar68);
      auVar65 = vinsertps_avx(ZEXT416((uint)fVar60),ZEXT416((uint)pIVar38->NavRectRel[0].Min.y),0x10
                             );
      auVar68 = vcmpps_avx(auVar65,auVar107,1);
      auVar65 = vminps_avx(auVar67,auVar65);
      auVar68 = vblendvps_avx(auVar65,auVar107,auVar68);
      auVar110._8_8_ = 0;
      auVar110._0_4_ = pIVar38->NavRectRel[0].Max.x;
      auVar110._4_4_ = pIVar38->NavRectRel[0].Max.y;
      auVar65 = vcmpps_avx(auVar110,auVar107,1);
      auVar67 = vminps_avx(auVar67,auVar110);
      auVar65 = vblendvps_avx(auVar67,auVar107,auVar65);
      IVar16 = (ImRect)vmovlhps_avx(auVar68,auVar65);
      pIVar38->NavRectRel[0] = IVar16;
      pIVar57->NavId = 0;
      pIVar57->NavFocusScopeId = 0;
      pIVar38 = pIVar57->NavWindow;
      goto LAB_00151587;
    }
    uVar54 = 0;
LAB_001515ab:
    IVar63 = pIVar38->NavRectRel[uVar54].Max;
    auVar68 = vmovshdup_avx(auVar99);
    fVar61 = auVar68._0_4_ + pIVar38->NavRectRel[uVar54].Min.y;
    IVar74.Min.x = IVar63.x + auVar99._0_4_;
    IVar74.Min.y = IVar63.y + auVar99._4_4_;
    IVar74.Max.x = auVar99._8_4_ + 0.0;
    IVar74.Max.y = auVar99._12_4_ + 0.0;
    auVar68 = ZEXT416((uint)(fVar60 + auVar99._0_4_ + 1.0));
  }
  else {
LAB_00151587:
    if (pIVar38 != (ImGuiWindow *)0x0) {
      uVar54 = (ulong)pIVar57->NavLayer;
      auVar99._8_8_ = 0;
      auVar99._0_4_ = (pIVar38->Pos).x;
      auVar99._4_4_ = (pIVar38->Pos).y;
      fVar60 = pIVar38->NavRectRel[uVar54].Min.x;
      goto LAB_001515ab;
    }
    auVar68 = SUB6416(ZEXT464(0x3f800000),0);
    fVar61 = 0.0;
  }
  (pIVar57->NavScoringRect).Min.y = local_78 + fVar61;
  auVar65 = vmovshdup_avx((undefined1  [16])IVar74);
  fVar60 = local_78 + auVar65._0_4_;
  (pIVar57->NavScoringRect).Max.y = fVar60;
  auVar68 = vminss_avx(auVar68,(undefined1  [16])IVar74);
  (pIVar57->NavScoringRect).Min.x = auVar68._0_4_;
  (pIVar57->NavScoringRect).Max.x = auVar68._0_4_;
  if (fVar60 < local_78 + fVar61) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x23c6,"void ImGui::NavUpdate()");
  }
  pIVar57->NavScoringCount = 0;
  pIVar4 = &(pIVar27->IO).MousePos;
  bVar29 = IsMousePosValid(pIVar4);
  if (bVar29) {
    IVar63 = (pIVar27->IO).MousePos;
    auVar75._0_4_ = (int)IVar63.x;
    auVar75._4_4_ = (int)IVar63.y;
    auVar75._8_8_ = 0;
    auVar68 = vcvtdq2ps_avx(auVar75);
    IVar63 = (ImVec2)vmovlps_avx(auVar68);
    pIVar27->LastValidMousePos = IVar63;
    IVar63 = (ImVec2)vmovlps_avx(auVar68);
    (pIVar27->IO).MousePos = IVar63;
  }
  bVar29 = IsMousePosValid(pIVar4);
  if ((bVar29) && (bVar29 = IsMousePosValid(&(pIVar27->IO).MousePosPrev), bVar29)) {
    auVar76._8_8_ = 0;
    auVar76._0_4_ = (pIVar27->IO).MousePos.x;
    auVar76._4_4_ = (pIVar27->IO).MousePos.y;
    auVar90._8_8_ = 0;
    auVar90._0_4_ = (pIVar27->IO).MousePosPrev.x;
    auVar90._4_4_ = (pIVar27->IO).MousePosPrev.y;
    auVar68 = vsubps_avx(auVar76,auVar90);
    IVar63 = (ImVec2)vmovlps_avx(auVar68);
    (pIVar27->IO).MouseDelta = IVar63;
    if ((auVar68._0_4_ == 0.0) && (!NAN(auVar68._0_4_))) {
      auVar68 = vmovshdup_avx(auVar68);
      if ((auVar68._0_4_ == 0.0) && (!NAN(auVar68._0_4_))) goto LAB_001516d3;
    }
    pIVar27->NavDisableMouseHover = false;
  }
  else {
    (pIVar27->IO).MouseDelta.x = 0.0;
    (pIVar27->IO).MouseDelta.y = 0.0;
  }
LAB_001516d3:
  (pIVar27->IO).MousePosPrev = (pIVar27->IO).MousePos;
  lVar55 = 0;
  do {
    if ((pIVar27->IO).MouseDown[lVar55] == true) {
      fVar60 = (pIVar27->IO).MouseDownDuration[lVar55];
      pbVar56 = (pIVar27->IO).MouseClicked + lVar55;
      *pbVar56 = fVar60 < 0.0;
      pbVar56[10] = false;
      (pIVar27->IO).MouseDownDurationPrev[lVar55] = fVar60;
      if (0.0 <= fVar60) {
        (pIVar27->IO).MouseDownDuration[lVar55] = fVar60 + (pIVar27->IO).DeltaTime;
        (pIVar27->IO).MouseDoubleClicked[lVar55] = false;
        bVar29 = IsMousePosValid(pIVar4);
        auVar68 = ZEXT816(0) << 0x40;
        if (bVar29) {
          auVar78._8_8_ = 0;
          auVar78._0_4_ = (pIVar27->IO).MousePos.x;
          auVar78._4_4_ = (pIVar27->IO).MousePos.y;
          pIVar5 = (pIVar27->IO).MouseClickedPos + lVar55;
          auVar93._8_8_ = 0;
          auVar93._0_4_ = pIVar5->x;
          auVar93._4_4_ = pIVar5->y;
          auVar68 = vsubps_avx(auVar78,auVar93);
        }
        fVar60 = auVar68._0_4_;
        auVar101._0_4_ = fVar60 * fVar60;
        auVar101._4_4_ = auVar68._4_4_ * auVar68._4_4_;
        fVar61 = auVar68._8_4_;
        auVar101._8_4_ = fVar61 * fVar61;
        fVar6 = auVar68._12_4_;
        auVar101._12_4_ = fVar6 * fVar6;
        auVar65 = vmovshdup_avx(auVar101);
        auVar67 = ZEXT416((uint)(pIVar27->IO).MouseDragMaxDistanceSqr[lVar55]);
        auVar86 = ZEXT416((uint)(fVar60 * fVar60 + auVar65._0_4_));
        auVar65 = vcmpss_avx(auVar86,auVar67,2);
        auVar65 = vblendvps_avx(auVar86,auVar67,auVar65);
        (pIVar27->IO).MouseDragMaxDistanceSqr[lVar55] = auVar65._0_4_;
        pIVar5 = (pIVar27->IO).MouseDragMaxDistanceAbs + lVar55;
        auVar94._8_8_ = 0;
        auVar94._0_4_ = pIVar5->x;
        auVar94._4_4_ = pIVar5->y;
        auVar102._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
        auVar102._8_4_ = -fVar61;
        auVar102._12_4_ = -fVar6;
        auVar65 = vmaxps_avx(auVar102,auVar68);
        auVar68 = vcmpps_avx(auVar65,auVar94,2);
        auVar68 = vblendvps_avx(auVar65,auVar94,auVar68);
        IVar63 = (ImVec2)vmovlps_avx(auVar68);
        (pIVar27->IO).MouseDragMaxDistanceAbs[lVar55] = IVar63;
      }
      else {
        (pIVar27->IO).MouseDownDuration[lVar55] = 0.0;
        (pIVar27->IO).MouseDoubleClicked[lVar55] = false;
        dVar64 = pIVar27->Time;
        if ((float)(dVar64 - (pIVar27->IO).MouseClickedTime[lVar55]) <
            (pIVar27->IO).MouseDoubleClickTime) {
          bVar29 = IsMousePosValid(pIVar4);
          auVar68 = ZEXT816(0) << 0x40;
          if (bVar29) {
            auVar77._8_8_ = 0;
            auVar77._0_4_ = (pIVar27->IO).MousePos.x;
            auVar77._4_4_ = (pIVar27->IO).MousePos.y;
            pIVar5 = (pIVar27->IO).MouseClickedPos + lVar55;
            auVar91._8_8_ = 0;
            auVar91._0_4_ = pIVar5->x;
            auVar91._4_4_ = pIVar5->y;
            auVar68 = vsubps_avx(auVar77,auVar91);
          }
          fVar61 = auVar68._0_4_;
          auVar92._0_4_ = fVar61 * fVar61;
          auVar92._4_4_ = auVar68._4_4_ * auVar68._4_4_;
          auVar92._8_4_ = auVar68._8_4_ * auVar68._8_4_;
          auVar92._12_4_ = auVar68._12_4_ * auVar68._12_4_;
          auVar68 = vmovshdup_avx(auVar92);
          fVar60 = (pIVar27->IO).MouseDoubleClickMaxDist;
          if (fVar61 * fVar61 + auVar68._0_4_ < fVar60 * fVar60) {
            (pIVar27->IO).MouseDoubleClicked[lVar55] = true;
          }
          dVar64 = (double)((pIVar27->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar27->IO).MouseClickedTime[lVar55] = dVar64;
        (pIVar27->IO).MouseClickedPos[lVar55] = (pIVar27->IO).MousePos;
        (pIVar27->IO).MouseDownWasDoubleClick[lVar55] = (pIVar27->IO).MouseDoubleClicked[lVar55];
        pIVar5 = (pIVar27->IO).MouseDragMaxDistanceAbs + lVar55;
        pIVar5->x = 0.0;
        pIVar5->y = 0.0;
        (pIVar27->IO).MouseDragMaxDistanceSqr[lVar55] = 0.0;
      }
    }
    else {
      (pIVar27->IO).MouseClicked[lVar55] = false;
      fVar60 = (pIVar27->IO).MouseDownDuration[lVar55];
      (pIVar27->IO).MouseReleased[lVar55] = 0.0 <= fVar60;
      pbVar56 = (pIVar27->IO).MouseClicked + lVar55;
      (pIVar27->IO).MouseDownDurationPrev[lVar55] = fVar60;
      (pIVar27->IO).MouseDownDuration[lVar55] = -1.0;
      (pIVar27->IO).MouseDoubleClicked[lVar55] = false;
    }
    if (((pIVar27->IO).MouseDown[lVar55] == false) && ((pIVar27->IO).MouseReleased[lVar55] == false)
       ) {
      (pIVar27->IO).MouseDownWasDoubleClick[lVar55] = false;
    }
    if (*pbVar56 == true) {
      pIVar27->NavDisableMouseHover = false;
    }
    lVar55 = lVar55 + 1;
  } while (lVar55 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar38 = GetTopMostPopupModal();
  if ((pIVar38 != (ImGuiWindow *)0x0) ||
     ((pIVar26->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar26->NavWindowingHighlightAlpha)))) {
    auVar68 = vminss_avx(ZEXT416((uint)((pIVar26->IO).DeltaTime * 6.0 + pIVar26->DimBgRatio)),
                         ZEXT416(0x3f800000));
    fVar60 = auVar68._0_4_;
  }
  else {
    auVar65 = ZEXT416((uint)((pIVar26->IO).DeltaTime * -10.0 + pIVar26->DimBgRatio));
    auVar68 = vcmpss_avx(ZEXT816(0) << 0x40,auVar65,2);
    auVar68 = vandps_avx(auVar68,auVar65);
    fVar60 = auVar68._0_4_;
  }
  pIVar26->DimBgRatio = fVar60;
  pIVar26->MouseCursor = 0;
  pIVar26->WantTextInputNextFrame = -1;
  pIVar26->WantCaptureMouseNextFrame = -1;
  pIVar26->WantCaptureKeyboardNextFrame = -1;
  (pIVar26->PlatformImePos).x = 1.0;
  pIVar57 = GImGui;
  (pIVar26->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar29 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar29) &&
        (fVar60 = (pIVar57->IO).MouseDragThreshold,
        fVar61 = (pIVar57->IO).MousePos.x - (pIVar57->WheelingWindowRefMousePos).x,
        fVar6 = (pIVar57->IO).MousePos.y - (pIVar57->WheelingWindowRefMousePos).y,
        fVar60 * fVar60 < fVar61 * fVar61 + fVar6 * fVar6)) || (pIVar57->WheelingWindowTimer <= 0.0)
       ) {
      pIVar57->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar57->WheelingWindowTimer = 0.0;
    }
  }
  pIVar27 = GImGui;
  fVar60 = (pIVar57->IO).MouseWheel;
  if (((((fVar60 != 0.0) || (fVar61 = (pIVar57->IO).MouseWheelH, fVar61 != 0.0)) || (NAN(fVar61)))
      && ((pIVar57->ActiveId == 0 || (pIVar57->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar57->HoveredIdPreviousFrame == 0 ||
       (pIVar57->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar38 = pIVar57->WheelingWindow, pIVar38 != (ImGuiWindow *)0x0 ||
        (pIVar38 = pIVar57->HoveredWindow, pIVar38 != (ImGuiWindow *)0x0)) &&
       (pIVar38->Collapsed == false)))))) {
    if ((fVar60 != 0.0) || (NAN(fVar60))) {
      if ((pIVar57->IO).KeyCtrl == true) {
        if ((pIVar57->IO).FontAllowUserScaling == true) {
          if (GImGui->WheelingWindow != pIVar38) {
            GImGui->WheelingWindow = pIVar38;
            pIVar27->WheelingWindowRefMousePos = (pIVar27->IO).MousePos;
            pIVar27->WheelingWindowTimer = 2.0;
            fVar60 = (pIVar57->IO).MouseWheel;
          }
          fVar61 = pIVar38->FontWindowScale;
          auVar65 = ZEXT416((uint)(fVar60 * 0.1 + fVar61));
          auVar68 = vcmpss_avx(auVar65,ZEXT416(0x3f000000),1);
          auVar65 = vminss_avx(SUB6416(ZEXT464(0x40200000),0),auVar65);
          auVar103._8_4_ = 0x3f000000;
          auVar103._0_8_ = 0x3f0000003f000000;
          auVar103._12_4_ = 0x3f000000;
          auVar68 = vblendvps_avx(auVar65,auVar103,auVar68);
          pIVar38->FontWindowScale = auVar68._0_4_;
          if ((pIVar38->Flags & 0x1000000) == 0) {
            fVar61 = auVar68._0_4_ / fVar61;
            fVar60 = 1.0 - fVar61;
            IVar63 = pIVar38->Pos;
            auVar95._8_8_ = 0;
            auVar95._0_4_ = IVar63.x;
            auVar95._4_4_ = IVar63.y;
            IVar7 = pIVar38->Size;
            auVar104._8_8_ = 0;
            auVar104._0_4_ = IVar7.x;
            auVar104._4_4_ = IVar7.y;
            auVar108._8_8_ = 0;
            auVar108._0_4_ = (pIVar57->IO).MousePos.x;
            auVar108._4_4_ = (pIVar57->IO).MousePos.y;
            auVar68 = vsubps_avx(auVar108,auVar95);
            auVar79._0_4_ = fVar60 * IVar7.x * auVar68._0_4_;
            auVar79._4_4_ = fVar60 * IVar7.y * auVar68._4_4_;
            auVar79._8_4_ = fVar60 * 0.0 * auVar68._8_4_;
            auVar79._12_4_ = fVar60 * 0.0 * auVar68._12_4_;
            auVar68 = vdivps_avx(auVar79,auVar104);
            auVar80._0_4_ = IVar63.x + auVar68._0_4_;
            auVar80._4_4_ = IVar63.y + auVar68._4_4_;
            auVar80._8_4_ = auVar68._8_4_ + 0.0;
            auVar80._12_4_ = auVar68._12_4_ + 0.0;
            IVar63 = (ImVec2)vmovlps_avx(auVar80);
            local_40.Min = IVar63;
            SetWindowPos(pIVar38,&local_40.Min,0);
            auVar96._0_4_ = (int)(fVar61 * (pIVar38->Size).x);
            auVar96._4_4_ = (int)(fVar61 * (pIVar38->Size).y);
            auVar96._8_4_ = (int)(fVar61 * 0.0);
            auVar96._12_4_ = (int)(fVar61 * 0.0);
            auVar68 = vcvtdq2ps_avx(auVar96);
            auVar81._0_4_ = (int)(fVar61 * (pIVar38->SizeFull).x);
            auVar81._4_4_ = (int)(fVar61 * (pIVar38->SizeFull).y);
            auVar81._8_4_ = (int)(fVar61 * 0.0);
            auVar81._12_4_ = (int)(fVar61 * 0.0);
            auVar65 = vcvtdq2ps_avx(auVar81);
            auVar68 = vmovlhps_avx(auVar68,auVar65);
            (pIVar38->Size).x = (float)(int)auVar68._0_8_;
            (pIVar38->Size).y = (float)(int)((ulong)auVar68._0_8_ >> 0x20);
            (pIVar38->SizeFull).x = (float)(int)auVar68._8_8_;
            (pIVar38->SizeFull).y = (float)(int)((ulong)auVar68._8_8_ >> 0x20);
          }
          goto LAB_00151afe;
        }
      }
      else if ((pIVar57->IO).KeyShift == false) {
        if (GImGui->WheelingWindow != pIVar38) {
          GImGui->WheelingWindow = pIVar38;
          pIVar27->WheelingWindowRefMousePos = (pIVar27->IO).MousePos;
          pIVar27->WheelingWindowTimer = 2.0;
        }
        uVar33 = pIVar38->Flags;
        while (((uVar33 >> 0x18 & 1) != 0 &&
               (((uVar33 & 0x210) == 0x10 ||
                ((fVar61 = (pIVar38->ScrollMax).y, fVar61 == 0.0 && (!NAN(fVar61)))))))) {
          pIVar38 = pIVar38->ParentWindow;
          uVar33 = pIVar38->Flags;
        }
        if ((uVar33 & 0x210) == 0) {
          fVar61 = pIVar27->FontBaseSize * pIVar38->FontWindowScale;
          if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
            fVar61 = fVar61 * pIVar38->ParentWindow->FontWindowScale;
          }
          auVar68 = vminss_avx(ZEXT416((uint)(fVar61 * 5.0)),
                               ZEXT416((uint)(((pIVar38->InnerRect).Max.y -
                                              (pIVar38->InnerRect).Min.y) * 0.67)));
          auVar105._0_4_ = (int)auVar68._0_4_;
          auVar105._4_4_ = (int)auVar68._4_4_;
          auVar105._8_4_ = (int)auVar68._8_4_;
          auVar105._12_4_ = (int)auVar68._12_4_;
          auVar68 = vcvtdq2ps_avx(auVar105);
          (pIVar38->ScrollTarget).y = (pIVar38->Scroll).y - fVar60 * auVar68._0_4_;
          (pIVar38->ScrollTargetCenterRatio).y = 0.0;
          (pIVar38->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    pIVar27 = GImGui;
    fVar60 = (pIVar57->IO).MouseWheelH;
    if (((fVar60 == 0.0) && (!NAN(fVar60))) || ((pIVar57->IO).KeyShift == true)) {
      fVar60 = (pIVar57->IO).MouseWheel;
      if (((fVar60 == 0.0) && (!NAN(fVar60))) || ((pIVar57->IO).KeyShift != true))
      goto LAB_00151afe;
    }
    if ((pIVar57->IO).KeyCtrl == false) {
      if (GImGui->WheelingWindow != pIVar38) {
        GImGui->WheelingWindow = pIVar38;
        pIVar27->WheelingWindowRefMousePos = (pIVar27->IO).MousePos;
        pIVar27->WheelingWindowTimer = 2.0;
      }
      uVar33 = pIVar38->Flags;
      while (((uVar33 >> 0x18 & 1) != 0 &&
             (((uVar33 & 0x210) == 0x10 ||
              ((fVar61 = (pIVar38->ScrollMax).x, fVar61 == 0.0 && (!NAN(fVar61)))))))) {
        pIVar38 = pIVar38->ParentWindow;
        uVar33 = pIVar38->Flags;
      }
      if ((uVar33 & 0x210) == 0) {
        fVar61 = pIVar27->FontBaseSize * pIVar38->FontWindowScale;
        if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
          fVar61 = fVar61 * pIVar38->ParentWindow->FontWindowScale;
        }
        auVar68 = vminss_avx(ZEXT416((uint)(fVar61 + fVar61)),
                             ZEXT416((uint)(((pIVar38->InnerRect).Max.x - (pIVar38->InnerRect).Min.x
                                            ) * 0.67)));
        auVar97._0_4_ = (int)auVar68._0_4_;
        auVar97._4_4_ = (int)auVar68._4_4_;
        auVar97._8_4_ = (int)auVar68._8_4_;
        auVar97._12_4_ = (int)auVar68._12_4_;
        auVar68 = vcvtdq2ps_avx(auVar97);
        (pIVar38->ScrollTarget).x = (pIVar38->Scroll).x - fVar60 * auVar68._0_4_;
        (pIVar38->ScrollTargetCenterRatio).x = 0.0;
        (pIVar38->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_00151afe:
  pIVar57 = GImGui;
  pIVar38 = GImGui->NavWindow;
  if ((((pIVar38 == (ImGuiWindow *)0x0) || (pIVar38->Active != true)) ||
      ((pIVar38->Flags & 0x40000) != 0)) ||
     (((GImGui->IO).KeyCtrl != false || (iVar45 = (GImGui->IO).KeyMap[0], iVar45 < 0)))) {
    GImGui->FocusTabPressed = false;
LAB_00151b9e:
    pIVar38 = pIVar57->FocusRequestNextWindow;
  }
  else {
    bVar29 = IsKeyPressed(iVar45,true);
    pIVar57->FocusTabPressed = bVar29;
    if ((!bVar29) || (pIVar57->ActiveId != 0)) goto LAB_00151b9e;
    pIVar38 = pIVar57->NavWindow;
    pIVar57->FocusRequestNextWindow = pIVar38;
    pIVar57->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar57->NavId == 0) || (pIVar57->NavIdTabCounter == 0x7fffffff)) {
      iVar45 = -(uint)(pIVar57->IO).KeyShift;
    }
    else {
      iVar45 = pIVar57->NavIdTabCounter + (-(uint)(pIVar57->IO).KeyShift | 1) + 1;
    }
    pIVar57->FocusRequestNextCounterTabStop = iVar45;
  }
  pIVar57->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar57->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar57->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar38 != (ImGuiWindow *)0x0) {
    pIVar57->FocusRequestCurrWindow = pIVar38;
    if ((pIVar57->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar45 = (pIVar38->DC).FocusCounterRegular, iVar45 != -1)) {
      pIVar57->FocusRequestCurrCounterRegular =
           (pIVar57->FocusRequestNextCounterRegular + iVar45 + 1) % (iVar45 + 1);
    }
    if ((pIVar57->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar45 = (pIVar38->DC).FocusCounterTabStop, iVar45 != -1)) {
      pIVar57->FocusRequestCurrCounterTabStop =
           (pIVar57->FocusRequestNextCounterTabStop + iVar45 + 1) % (iVar45 + 1);
    }
    pIVar57->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar57->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar57->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar57->NavIdTabCounter = 0x7fffffff;
  uVar33 = (pIVar26->WindowsFocusOrder).Size;
  if (uVar33 != (pIVar26->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf93,"void ImGui::NewFrame()");
  }
  local_78 = 3.4028235e+38;
  if ((pIVar26->GcCompactAll == false) &&
     (fVar60 = (pIVar26->IO).ConfigMemoryCompactTimer, 0.0 <= fVar60)) {
    local_78 = (float)pIVar26->Time - fVar60;
  }
  if (uVar33 != 0) {
    uVar54 = 0;
    do {
      if ((long)(int)uVar33 <= (long)uVar54) {
        pcVar43 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0015295f;
      }
      pIVar38 = (pIVar26->Windows).Data[uVar54];
      bVar29 = pIVar38->Active;
      pIVar38->WasActive = bVar29;
      pIVar38->BeginCount = 0;
      pIVar38->Active = false;
      pIVar38->WriteAccessed = false;
      if (((bVar29 == false) && (pIVar38->MemoryCompacted == false)) &&
         (pIVar38->LastTimeActive < local_78)) {
        GcCompactTransientWindowBuffers(pIVar38);
        uVar33 = (pIVar26->Windows).Size;
      }
      uVar54 = uVar54 + 1;
    } while (uVar54 != uVar33);
  }
  iVar45 = (pIVar26->TablesLastTimeActive).Size;
  if (0 < iVar45) {
    lVar55 = 0;
    lVar58 = 0;
    do {
      fVar60 = (pIVar26->TablesLastTimeActive).Data[lVar58];
      if ((0.0 <= fVar60) && (fVar60 < local_78)) {
        if ((pIVar26->Tables).Buf.Size <= lVar58) {
          pcVar43 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_0015295f;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar26->Tables).Buf.Data)->ID + lVar55));
        iVar45 = (pIVar26->TablesLastTimeActive).Size;
      }
      lVar58 = lVar58 + 1;
      lVar55 = lVar55 + 600;
    } while (lVar58 < iVar45);
  }
  if (pIVar26->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar26->GcCompactAll = false;
  if ((pIVar26->NavWindow != (ImGuiWindow *)0x0) && (pIVar26->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar26->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar13 = (pIVar26->CurrentWindowStack).Data;
    if (ppIVar13 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar13,(long)(pIVar26->CurrentWindowStack).Size << 3);
      ppIVar13 = (pIVar26->CurrentWindowStack).Data;
      if ((ppIVar13 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar13,GImAllocatorUserData);
    }
    (pIVar26->CurrentWindowStack).Data = __dest_00;
    (pIVar26->CurrentWindowStack).Capacity = 0;
  }
  (pIVar26->CurrentWindowStack).Size = 0;
  if ((pIVar26->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar14 = (pIVar26->BeginPopupStack).Data;
    if (pIVar14 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar14,(long)(pIVar26->BeginPopupStack).Size * 0x30);
      pIVar14 = (pIVar26->BeginPopupStack).Data;
      if ((pIVar14 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar14,GImAllocatorUserData);
    }
    (pIVar26->BeginPopupStack).Data = __dest_01;
    (pIVar26->BeginPopupStack).Capacity = 0;
  }
  (pIVar26->BeginPopupStack).Size = 0;
  iVar45 = (pIVar26->ItemFlagsStack).Capacity;
  if (iVar45 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    piVar39 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar40 = (pIVar26->ItemFlagsStack).Data;
    if (piVar40 != (int *)0x0) {
      memcpy(piVar39,piVar40,(long)(pIVar26->ItemFlagsStack).Size << 2);
      piVar40 = (pIVar26->ItemFlagsStack).Data;
      if ((piVar40 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar40,GImAllocatorUserData);
    }
    (pIVar26->ItemFlagsStack).Data = piVar39;
    (pIVar26->ItemFlagsStack).Size = 0;
    (pIVar26->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar26->ItemFlagsStack).Size = 0;
    if (iVar45 != 0) {
      piVar40 = (pIVar26->ItemFlagsStack).Data;
      lVar55 = 0;
      goto LAB_00151fe0;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar40 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar40 = *piVar40 + 1;
  }
  piVar40 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar39 = (pIVar26->ItemFlagsStack).Data;
  if (piVar39 != (int *)0x0) {
    memcpy(piVar40,piVar39,(long)(pIVar26->ItemFlagsStack).Size << 2);
    piVar39 = (pIVar26->ItemFlagsStack).Data;
    if ((piVar39 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar39,GImAllocatorUserData);
  }
  (pIVar26->ItemFlagsStack).Data = piVar40;
  (pIVar26->ItemFlagsStack).Capacity = 8;
  lVar55 = (long)(pIVar26->ItemFlagsStack).Size;
LAB_00151fe0:
  piVar40[lVar55] = 0;
  (pIVar26->ItemFlagsStack).Size = (pIVar26->ItemFlagsStack).Size + 1;
  if ((pIVar26->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar40 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar40 = *piVar40 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar15 = (pIVar26->GroupStack).Data;
    if (pIVar15 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar15,(long)(pIVar26->GroupStack).Size * 0x30);
      pIVar15 = (pIVar26->GroupStack).Data;
      if ((pIVar15 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar40 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar40 = *piVar40 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
    }
    (pIVar26->GroupStack).Data = __dest_02;
    (pIVar26->GroupStack).Capacity = 0;
  }
  (pIVar26->GroupStack).Size = 0;
  ClosePopupsOverWindow(pIVar26->NavWindow,false);
  pIVar57 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar57->DebugItemPickerActive == true) {
    uVar33 = pIVar57->HoveredIdPreviousFrame;
    pIVar57->MouseCursor = 7;
    iVar45 = (pIVar57->IO).KeyMap[0xe];
    if ((-1 < iVar45) && (bVar29 = IsKeyPressed(iVar45,true), bVar29)) {
      pIVar57->DebugItemPickerActive = false;
    }
    pIVar27 = GImGui;
    fVar60 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar60 != 0.0) || (NAN(fVar60))) {
      uVar36 = (uint)(uVar33 == 0);
    }
    else if (uVar33 == 0) {
      uVar36 = 1;
    }
    else {
      pIVar57->DebugItemPickerBreakId = uVar33;
      pIVar57->DebugItemPickerActive = false;
      uVar36 = 0;
    }
    pIVar3 = &pIVar27->NextWindowData;
    *(byte *)&pIVar3->Flags = (byte)pIVar3->Flags | 0x40;
    (pIVar27->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar33);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar36 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar57 = GImGui;
  }
  pIVar26->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar57->NextWindowData).Flags = (byte)(pIVar57->NextWindowData).Flags | 2;
  (pIVar57->NextWindowData).SizeVal.x = 400.0;
  (pIVar57->NextWindowData).SizeVal.y = 400.0;
  (pIVar57->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar26->CurrentWindow->IsFallbackWindow != false) {
    iVar45 = (pIVar26->Hooks).Size;
    if (0 < iVar45) {
      lVar55 = 0;
      lVar58 = 0;
      do {
        pIVar9 = (pIVar26->Hooks).Data;
        if (*(int *)(pIVar9 + lVar55 + 4) == 1) {
          (**(code **)(pIVar9 + lVar55 + 0x10))(pIVar26,pIVar9 + lVar55);
          iVar45 = (pIVar26->Hooks).Size;
        }
        lVar58 = lVar58 + 1;
        lVar55 = lVar55 + 0x20;
      } while (lVar58 < iVar45);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xfc0,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;
    
    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}